

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::GetWalletForJSONRPCRequest(wallet *this,JSONRPCRequest *request)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  WalletContext *context;
  UniValue *pUVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar5;
  allocator<char> local_71;
  size_t count;
  string local_68;
  string wallet_name;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet_name._M_dataplus._M_p._0_1_ = request->mode == EXECUTE;
  inline_check_non_fatal<bool>
            ((bool *)&wallet_name,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/util.cpp"
             ,0x4b,"GetWalletForJSONRPCRequest","request.mode == JSONRPCRequest::EXECUTE");
  context = EnsureWalletContext((any *)&request->context);
  wallet_name._M_dataplus._M_p = (pointer)&wallet_name.field_2;
  wallet_name._M_string_length = 0;
  wallet_name.field_2._M_local_buf[0] = '\0';
  bVar3 = GetWalletNameFromJSONRPCRequest(request,&wallet_name);
  if (bVar3) {
    GetWallet(this,context,&wallet_name);
    if (*(long *)this == 0) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Requested wallet does not exist or is not loaded",
                 (allocator<char> *)&count);
      JSONRPCError(pUVar4,-0x12,&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002a9bc3;
    }
  }
  else {
    count = 0;
    GetDefaultWallet(this,context,&count);
    sVar2 = count;
    if (*(long *)this == 0) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      if (sVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,
                   "No wallet is loaded. Load a wallet using loadwallet or create a new one with createwallet. (Note: A default wallet is no longer automatically created)"
                   ,&local_71);
        JSONRPCError(pUVar4,-0x12,&local_68);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,
                   "Multiple wallets are loaded. Please select which wallet to use by requesting the RPC through the /wallet/<walletname> URI path."
                   ,&local_71);
        JSONRPCError(pUVar4,-0x13,&local_68);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      goto LAB_002a9bc3;
    }
  }
  std::__cxx11::string::~string((string *)&wallet_name);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_002a9bc3:
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> GetWalletForJSONRPCRequest(const JSONRPCRequest& request)
{
    CHECK_NONFATAL(request.mode == JSONRPCRequest::EXECUTE);
    WalletContext& context = EnsureWalletContext(request.context);

    std::string wallet_name;
    if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
        std::shared_ptr<CWallet> pwallet = GetWallet(context, wallet_name);
        if (!pwallet) throw JSONRPCError(RPC_WALLET_NOT_FOUND, "Requested wallet does not exist or is not loaded");
        return pwallet;
    }

    size_t count{0};
    auto wallet = GetDefaultWallet(context, count);
    if (wallet) return wallet;

    if (count == 0) {
        throw JSONRPCError(
            RPC_WALLET_NOT_FOUND, "No wallet is loaded. Load a wallet using loadwallet or create a new one with createwallet. (Note: A default wallet is no longer automatically created)");
    }
    throw JSONRPCError(RPC_WALLET_NOT_SPECIFIED,
        "Multiple wallets are loaded. Please select which wallet to use by requesting the RPC through the /wallet/<walletname> URI path.");
}